

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_ir.c
# Opt level: O0

TRef lj_ir_emit(jit_State *J)

{
  byte bVar1;
  uint uVar2;
  undefined2 *puVar3;
  long in_RDI;
  IROp op;
  IRIns *ir;
  IRRef ref;
  IRRef ref_1;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  
  uVar2 = *(uint *)(in_RDI + 8);
  if (*(uint *)(in_RDI + 0x108) <= uVar2) {
    lj_ir_growtop((jit_State *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
  }
  *(uint *)(in_RDI + 8) = uVar2 + 1;
  puVar3 = (undefined2 *)(*(long *)(in_RDI + 0x10) + (ulong)uVar2 * 8);
  bVar1 = *(byte *)(in_RDI + 0x9d);
  puVar3[3] = *(undefined2 *)(in_RDI + 0x140 + (ulong)(uint)bVar1 * 2);
  *(short *)(in_RDI + 0x140 + (ulong)(uint)bVar1 * 2) = (short)uVar2;
  *(byte *)((long)puVar3 + 5) = bVar1;
  *puVar3 = *(undefined2 *)(in_RDI + 0x98);
  puVar3[1] = *(undefined2 *)(in_RDI + 0x9a);
  *(byte *)(in_RDI + 0x96) = *(byte *)(in_RDI + 0x96) | *(byte *)(in_RDI + 0x9c);
  *(undefined1 *)(puVar3 + 2) = *(undefined1 *)(in_RDI + 0x9c);
  return uVar2 + (uint)*(byte *)(puVar3 + 2) * 0x1000000;
}

Assistant:

TRef LJ_FASTCALL lj_ir_emit(jit_State *J)
{
  IRRef ref = lj_ir_nextins(J);
  IRIns *ir = IR(ref);
  IROp op = fins->o;
  ir->prev = J->chain[op];
  J->chain[op] = (IRRef1)ref;
  ir->o = op;
  ir->op1 = fins->op1;
  ir->op2 = fins->op2;
  J->guardemit.irt |= fins->t.irt;
  return TREF(ref, irt_t((ir->t = fins->t)));
}